

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::readConfig_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this)

{
  Client *client;
  uint *local_a0;
  undefined8 local_98;
  uint local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  uint *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  string local_60;
  Url local_40;
  
  if (this->version_ == v2) {
    client = this->client_;
    Vault::operator+(&local_60,"/v1/",&this->mount_);
    local_a0 = &local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/config","");
    if (local_a0 == &local_90) {
      uStack_68 = uStack_88;
      uStack_64 = uStack_84;
      local_80 = (uint *)&local_70;
    }
    else {
      local_80 = local_a0;
    }
    local_70 = CONCAT44(uStack_8c,local_90);
    local_78 = local_98;
    local_98 = 0;
    local_90 = local_90 & 0xffffff00;
    local_a0 = &local_90;
    (*client->_vptr_Client[3])(&local_40,client,&local_60);
    HttpConsumer::get(__return_storage_ptr__,client,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.value_._M_dataplus._M_p != &local_40.value_.field_2) {
      operator_delete(local_40.value_._M_dataplus._M_p,
                      local_40.value_.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != (uint *)&local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,CONCAT44(uStack_8c,local_90) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::KeyValue::readConfig() {
  if (version_ != KeyValue::Version::v2) {
    return std::nullopt;
  }

  return Vault::HttpConsumer::get(
      client_, client_.getUrl("/v1/" + mount_, Vault::Path{"/config"}));
}